

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<tinyusdz::value::half> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::half>
          (optional<tinyusdz::value::half> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::half> local_1c;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<tinyusdz::value::half>(&local_1c,this);
  nonstd::optional_lite::optional<tinyusdz::value::half>::optional<tinyusdz::value::half,_0>
            (__return_storage_ptr__,&local_1c);
  nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_1c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }